

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined1 (*pauVar1) [32];
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  byte bVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 (*pauVar29) [16];
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  long lVar38;
  undefined1 (*pauVar39) [16];
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 in_ZMM10 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar60 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  vint8 bi;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  float local_2520;
  float fStack_251c;
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  undefined4 local_2500;
  undefined4 uStack_24fc;
  undefined4 uStack_24f8;
  undefined4 uStack_24f4;
  undefined4 uStack_24f0;
  undefined4 uStack_24ec;
  undefined4 uStack_24e8;
  undefined4 uStack_24e4;
  undefined4 local_24e0;
  undefined4 uStack_24dc;
  undefined4 uStack_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  float local_24a0;
  float fStack_249c;
  float fStack_2498;
  float fStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  float fStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar30 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  local_2480 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_24a0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_24c0 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_24e0 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_24dc = local_24e0;
  uStack_24d8 = local_24e0;
  uStack_24d4 = local_24e0;
  uStack_24d0 = local_24e0;
  uStack_24cc = local_24e0;
  uStack_24c8 = local_24e0;
  uStack_24c4 = local_24e0;
  local_2500 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_24fc = local_2500;
  uStack_24f8 = local_2500;
  uStack_24f4 = local_2500;
  uStack_24f0 = local_2500;
  uStack_24ec = local_2500;
  uStack_24e8 = local_2500;
  uStack_24e4 = local_2500;
  local_2520 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_251c = local_2520;
  fStack_2518 = local_2520;
  fStack_2514 = local_2520;
  fStack_2510 = local_2520;
  fStack_250c = local_2520;
  fStack_2508 = local_2520;
  fStack_2504 = local_2520;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar51._4_4_ = fVar2;
  auVar51._0_4_ = fVar2;
  auVar51._8_4_ = fVar2;
  auVar51._12_4_ = fVar2;
  auVar51._16_4_ = fVar2;
  auVar51._20_4_ = fVar2;
  auVar51._24_4_ = fVar2;
  auVar51._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar54._4_4_ = fVar3;
  auVar54._0_4_ = fVar3;
  auVar54._8_4_ = fVar3;
  auVar54._12_4_ = fVar3;
  auVar54._16_4_ = fVar3;
  auVar54._20_4_ = fVar3;
  auVar54._24_4_ = fVar3;
  auVar54._28_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar55._4_4_ = fVar4;
  auVar55._0_4_ = fVar4;
  auVar55._8_4_ = fVar4;
  auVar55._12_4_ = fVar4;
  auVar55._16_4_ = fVar4;
  auVar55._20_4_ = fVar4;
  auVar55._24_4_ = fVar4;
  auVar55._28_4_ = fVar4;
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar42 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar5 = (tray->tnear).field_0.i[k];
  auVar56._4_4_ = iVar5;
  auVar56._0_4_ = iVar5;
  auVar56._8_4_ = iVar5;
  auVar56._12_4_ = iVar5;
  auVar56._16_4_ = iVar5;
  auVar56._20_4_ = iVar5;
  auVar56._24_4_ = iVar5;
  auVar56._28_4_ = iVar5;
  iVar5 = (tray->tfar).field_0.i[k];
  auVar43 = ZEXT3264(CONCAT428(iVar5,CONCAT424(iVar5,CONCAT420(iVar5,CONCAT416(iVar5,CONCAT412(iVar5
                                                  ,CONCAT48(iVar5,CONCAT44(iVar5,iVar5))))))));
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  auVar59._0_4_ = fVar2 * -local_2480;
  auVar59._4_4_ = fVar2 * -local_2480;
  auVar59._8_4_ = fVar2 * -local_2480;
  auVar59._12_4_ = fVar2 * -local_2480;
  auVar59._16_4_ = fVar2 * -local_2480;
  auVar59._20_4_ = fVar2 * -local_2480;
  auVar59._28_36_ = in_ZMM10._28_36_;
  auVar59._24_4_ = fVar2 * -local_2480;
  fStack_249c = local_24a0;
  fStack_2498 = local_24a0;
  fStack_2494 = local_24a0;
  fStack_2490 = local_24a0;
  fStack_248c = local_24a0;
  fStack_2488 = local_24a0;
  fStack_2484 = local_24a0;
  auVar60._0_4_ = fVar3 * -local_24a0;
  auVar60._4_4_ = fVar3 * -local_24a0;
  auVar60._8_4_ = fVar3 * -local_24a0;
  auVar60._12_4_ = fVar3 * -local_24a0;
  auVar60._16_4_ = fVar3 * -local_24a0;
  auVar60._20_4_ = fVar3 * -local_24a0;
  auVar60._28_36_ = in_ZMM11._28_36_;
  auVar60._24_4_ = fVar3 * -local_24a0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  auVar61._0_4_ = fVar4 * -local_24c0;
  auVar61._4_4_ = fVar4 * -local_24c0;
  auVar61._8_4_ = fVar4 * -local_24c0;
  auVar61._12_4_ = fVar4 * -local_24c0;
  auVar61._16_4_ = fVar4 * -local_24c0;
  auVar61._20_4_ = fVar4 * -local_24c0;
  auVar61._28_36_ = in_ZMM12._28_36_;
  auVar61._24_4_ = fVar4 * -local_24c0;
  do {
    pauVar29 = pauVar30 + -1;
    pauVar30 = pauVar30 + -1;
    if (*(float *)(*pauVar29 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      pauVar29 = pauVar30;
      uVar34 = *(ulong *)*pauVar30;
      while (pauVar30 = pauVar29, (uVar34 & 8) == 0) {
        fVar2 = *(float *)(ray + k * 4 + 0x70);
        uVar33 = (uint)uVar34 & 7;
        uVar31 = uVar34 & 0xfffffffffffffff0;
        if (uVar33 == 3) {
          local_2400 = *(undefined1 (*) [32])(uVar31 + 0x40);
          local_23e0 = *(undefined1 (*) [32])(uVar31 + 0x60);
          pauVar1 = (undefined1 (*) [32])(uVar31 + 0x80);
          local_2540 = *(undefined8 *)*pauVar1;
          uStack_2538 = *(undefined8 *)(uVar31 + 0x88);
          uStack_2530 = *(undefined8 *)(uVar31 + 0x90);
          uStack_2528 = *(undefined8 *)(uVar31 + 0x98);
          local_2420 = *(undefined1 (*) [32])(uVar31 + 0xa0);
          local_23c0 = *(undefined1 (*) [32])(uVar31 + 0xc0);
          local_2440 = *(undefined1 (*) [32])(uVar31 + 0xe0);
          auVar15 = *(undefined1 (*) [32])(uVar31 + 0x100);
          auVar16 = *(undefined1 (*) [32])(uVar31 + 0x120);
          auVar17 = *(undefined1 (*) [32])(uVar31 + 0x140);
          fVar3 = 1.0 - fVar2;
          auVar63._4_4_ = fVar3;
          auVar63._0_4_ = fVar3;
          auVar63._8_4_ = fVar3;
          auVar63._12_4_ = fVar3;
          auVar63._16_4_ = fVar3;
          auVar63._20_4_ = fVar3;
          auVar63._24_4_ = fVar3;
          auVar63._28_4_ = fVar3;
          local_2460._0_4_ = fVar2 * *(float *)(uVar31 + 0x1c0);
          local_2460._4_4_ = fVar2 * *(float *)(uVar31 + 0x1c4);
          local_2460._8_4_ = fVar2 * *(float *)(uVar31 + 0x1c8);
          local_2460._12_4_ = fVar2 * *(float *)(uVar31 + 0x1cc);
          local_2460._16_4_ = fVar2 * *(float *)(uVar31 + 0x1d0);
          local_2460._20_4_ = fVar2 * *(float *)(uVar31 + 0x1d4);
          local_2460._24_4_ = fVar2 * *(float *)(uVar31 + 0x1d8);
          local_2460._28_4_ = 0;
          auVar9._4_4_ = fStack_251c * auVar15._4_4_;
          auVar9._0_4_ = local_2520 * auVar15._0_4_;
          auVar9._8_4_ = fStack_2518 * auVar15._8_4_;
          auVar9._12_4_ = fStack_2514 * auVar15._12_4_;
          auVar9._16_4_ = fStack_2510 * auVar15._16_4_;
          auVar9._20_4_ = fStack_250c * auVar15._20_4_;
          auVar9._24_4_ = fStack_2508 * auVar15._24_4_;
          auVar9._28_4_ = 0;
          auVar52._0_4_ = local_2520 * auVar16._0_4_;
          auVar52._4_4_ = fStack_251c * auVar16._4_4_;
          auVar52._8_4_ = fStack_2518 * auVar16._8_4_;
          auVar52._12_4_ = fStack_2514 * auVar16._12_4_;
          auVar52._16_4_ = fStack_2510 * auVar16._16_4_;
          auVar52._20_4_ = fStack_250c * auVar16._20_4_;
          auVar52._24_4_ = fStack_2508 * auVar16._24_4_;
          auVar52._28_4_ = 0;
          auVar27._4_4_ = uStack_24fc;
          auVar27._0_4_ = local_2500;
          auVar27._8_4_ = uStack_24f8;
          auVar27._12_4_ = uStack_24f4;
          auVar27._16_4_ = uStack_24f0;
          auVar27._20_4_ = uStack_24ec;
          auVar27._24_4_ = uStack_24e8;
          auVar27._28_4_ = uStack_24e4;
          auVar44 = vfmadd231ps_fma(auVar9,auVar27,local_2420);
          auVar47 = vfmadd231ps_fma(auVar52,auVar27,local_23c0);
          auVar28._4_4_ = uStack_24dc;
          auVar28._0_4_ = local_24e0;
          auVar28._8_4_ = uStack_24d8;
          auVar28._12_4_ = uStack_24d4;
          auVar28._16_4_ = uStack_24d0;
          auVar28._20_4_ = uStack_24cc;
          auVar28._24_4_ = uStack_24c8;
          auVar28._28_4_ = uStack_24c4;
          auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar28,local_2400);
          auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar28,local_23e0);
          auVar62._8_4_ = 0x7fffffff;
          auVar62._0_8_ = 0x7fffffff7fffffff;
          auVar62._12_4_ = 0x7fffffff;
          auVar62._16_4_ = 0x7fffffff;
          auVar62._20_4_ = 0x7fffffff;
          auVar62._24_4_ = 0x7fffffff;
          auVar62._28_4_ = 0x7fffffff;
          auVar9 = vandps_avx(auVar62,ZEXT1632(auVar44));
          auVar57._8_4_ = 0x219392ef;
          auVar57._0_8_ = 0x219392ef219392ef;
          auVar57._12_4_ = 0x219392ef;
          auVar57._16_4_ = 0x219392ef;
          auVar57._20_4_ = 0x219392ef;
          auVar57._24_4_ = 0x219392ef;
          auVar57._28_4_ = 0x219392ef;
          auVar9 = vcmpps_avx(auVar9,auVar57,1);
          auVar10 = vblendvps_avx(ZEXT1632(auVar44),auVar57,auVar9);
          auVar9 = vandps_avx(auVar62,ZEXT1632(auVar47));
          auVar9 = vcmpps_avx(auVar9,auVar57,1);
          auVar52 = vblendvps_avx(ZEXT1632(auVar47),auVar57,auVar9);
          auVar11._4_4_ = fStack_251c * auVar17._4_4_;
          auVar11._0_4_ = local_2520 * auVar17._0_4_;
          auVar11._8_4_ = fStack_2518 * auVar17._8_4_;
          auVar11._12_4_ = fStack_2514 * auVar17._12_4_;
          auVar11._16_4_ = fStack_2510 * auVar17._16_4_;
          auVar11._20_4_ = fStack_250c * auVar17._20_4_;
          auVar11._24_4_ = fStack_2508 * auVar17._24_4_;
          auVar11._28_4_ = auVar9._28_4_;
          auVar44 = vfmadd231ps_fma(auVar11,auVar27,local_2440);
          auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar28,*pauVar1);
          auVar9 = vandps_avx(auVar62,ZEXT1632(auVar44));
          auVar11 = vcmpps_avx(auVar9,auVar57,1);
          auVar9 = vblendvps_avx(ZEXT1632(auVar44),auVar57,auVar11);
          auVar13._4_4_ = fVar2 * *(float *)(uVar31 + 0x1e4);
          auVar13._0_4_ = fVar2 * *(float *)(uVar31 + 0x1e0);
          auVar13._8_4_ = fVar2 * *(float *)(uVar31 + 0x1e8);
          auVar13._12_4_ = fVar2 * *(float *)(uVar31 + 0x1ec);
          auVar13._16_4_ = fVar2 * *(float *)(uVar31 + 0x1f0);
          auVar13._20_4_ = fVar2 * *(float *)(uVar31 + 500);
          auVar13._24_4_ = fVar2 * *(float *)(uVar31 + 0x1f8);
          auVar13._28_4_ = fStack_2504;
          auVar12 = vfmadd231ps_fma(local_2460,auVar63,ZEXT832(0) << 0x20);
          auVar18 = vfmadd231ps_fma(auVar13,auVar63,ZEXT832(0) << 0x20);
          auVar21._4_4_ = fVar2 * *(float *)(uVar31 + 0x204);
          auVar21._0_4_ = fVar2 * *(float *)(uVar31 + 0x200);
          auVar21._8_4_ = fVar2 * *(float *)(uVar31 + 0x208);
          auVar21._12_4_ = fVar2 * *(float *)(uVar31 + 0x20c);
          auVar21._16_4_ = fVar2 * *(float *)(uVar31 + 0x210);
          auVar21._20_4_ = fVar2 * *(float *)(uVar31 + 0x214);
          auVar21._24_4_ = fVar2 * *(float *)(uVar31 + 0x218);
          auVar21._28_4_ = uStack_24e4;
          auVar19 = vfmadd231ps_fma(auVar21,auVar63,ZEXT832(0) << 0x20);
          auVar53._0_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x220);
          auVar53._4_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x224);
          auVar53._8_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x228);
          auVar53._12_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x22c);
          auVar53._16_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x230);
          auVar53._20_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x234);
          auVar53._24_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x238);
          auVar53._28_4_ = fVar3 + auVar11._28_4_;
          auVar50._0_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x240);
          auVar50._4_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x244);
          auVar50._8_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x248);
          auVar50._12_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x24c);
          auVar50._16_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x250);
          auVar50._20_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x254);
          auVar50._24_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 600);
          auVar50._28_4_ = fVar3 + 0.0;
          auVar11 = vrcpps_avx(auVar10);
          auVar64._0_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x260);
          auVar64._4_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x264);
          auVar64._8_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x268);
          auVar64._12_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x26c);
          auVar64._16_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x270);
          auVar64._20_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x274);
          auVar64._24_4_ = fVar3 + fVar2 * *(float *)(uVar31 + 0x278);
          auVar64._28_4_ = fVar3 + 0.0;
          auVar13 = vrcpps_avx(auVar52);
          auVar58._8_4_ = 0x3f800000;
          auVar58._0_8_ = 0x3f8000003f800000;
          auVar58._12_4_ = 0x3f800000;
          auVar58._16_4_ = 0x3f800000;
          auVar58._20_4_ = 0x3f800000;
          auVar58._24_4_ = 0x3f800000;
          auVar58._28_4_ = 0x3f800000;
          auVar44 = vfnmadd213ps_fma(auVar10,auVar11,auVar58);
          auVar44 = vfmadd132ps_fma(ZEXT1632(auVar44),auVar11,auVar11);
          auVar47 = vfnmadd213ps_fma(auVar52,auVar13,auVar58);
          auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar13,auVar13);
          auVar10 = vrcpps_avx(auVar9);
          auVar48 = vfnmadd213ps_fma(auVar9,auVar10,auVar58);
          auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar10,auVar10);
          auVar10._4_4_ = fStack_24bc;
          auVar10._0_4_ = local_24c0;
          auVar10._8_4_ = fStack_24b8;
          auVar10._12_4_ = fStack_24b4;
          auVar10._16_4_ = fStack_24b0;
          auVar10._20_4_ = fStack_24ac;
          auVar10._24_4_ = fStack_24a8;
          auVar10._28_4_ = fStack_24a4;
          auVar45 = vfmadd213ps_fma(auVar15,auVar10,*(undefined1 (*) [32])(uVar31 + 0x160));
          auVar15._4_4_ = fStack_249c;
          auVar15._0_4_ = local_24a0;
          auVar15._8_4_ = fStack_2498;
          auVar15._12_4_ = fStack_2494;
          auVar15._16_4_ = fStack_2490;
          auVar15._20_4_ = fStack_248c;
          auVar15._24_4_ = fStack_2488;
          auVar15._28_4_ = fStack_2484;
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar15,local_2420);
          auVar45 = vfmadd213ps_fma(auVar16,auVar10,*(undefined1 (*) [32])(uVar31 + 0x180));
          auVar49 = vfmadd213ps_fma(auVar17,auVar10,*(undefined1 (*) [32])(uVar31 + 0x1a0));
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar15,local_23c0);
          auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar15,local_2440);
          auVar16._4_4_ = fStack_247c;
          auVar16._0_4_ = local_2480;
          auVar16._8_4_ = fStack_2478;
          auVar16._12_4_ = fStack_2474;
          auVar16._16_4_ = fStack_2470;
          auVar16._20_4_ = fStack_246c;
          auVar16._24_4_ = fStack_2468;
          auVar16._28_4_ = fStack_2464;
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar16,local_2400);
          auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar16,local_23e0);
          auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar16,*pauVar1);
          auVar15 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar20));
          auVar16 = vsubps_avx(auVar53,ZEXT1632(auVar20));
          auVar17 = vsubps_avx(ZEXT1632(auVar18),ZEXT1632(auVar45));
          auVar9 = vsubps_avx(auVar50,ZEXT1632(auVar45));
          auVar10 = vsubps_avx(ZEXT1632(auVar19),ZEXT1632(auVar49));
          auVar52 = vsubps_avx(auVar64,ZEXT1632(auVar49));
          auVar22._4_4_ = auVar44._4_4_ * auVar15._4_4_;
          auVar22._0_4_ = auVar44._0_4_ * auVar15._0_4_;
          auVar22._8_4_ = auVar44._8_4_ * auVar15._8_4_;
          auVar22._12_4_ = auVar44._12_4_ * auVar15._12_4_;
          auVar22._16_4_ = auVar15._16_4_ * 0.0;
          auVar22._20_4_ = auVar15._20_4_ * 0.0;
          auVar22._24_4_ = auVar15._24_4_ * 0.0;
          auVar22._28_4_ = auVar15._28_4_;
          auVar23._4_4_ = auVar44._4_4_ * auVar16._4_4_;
          auVar23._0_4_ = auVar44._0_4_ * auVar16._0_4_;
          auVar23._8_4_ = auVar44._8_4_ * auVar16._8_4_;
          auVar23._12_4_ = auVar44._12_4_ * auVar16._12_4_;
          auVar23._16_4_ = auVar16._16_4_ * 0.0;
          auVar23._20_4_ = auVar16._20_4_ * 0.0;
          auVar23._24_4_ = auVar16._24_4_ * 0.0;
          auVar23._28_4_ = auVar16._28_4_;
          auVar24._4_4_ = auVar47._4_4_ * auVar17._4_4_;
          auVar24._0_4_ = auVar47._0_4_ * auVar17._0_4_;
          auVar24._8_4_ = auVar47._8_4_ * auVar17._8_4_;
          auVar24._12_4_ = auVar47._12_4_ * auVar17._12_4_;
          auVar24._16_4_ = auVar17._16_4_ * 0.0;
          auVar24._20_4_ = auVar17._20_4_ * 0.0;
          auVar24._24_4_ = auVar17._24_4_ * 0.0;
          auVar24._28_4_ = auVar17._28_4_;
          auVar17._4_4_ = auVar48._4_4_ * auVar10._4_4_;
          auVar17._0_4_ = auVar48._0_4_ * auVar10._0_4_;
          auVar17._8_4_ = auVar48._8_4_ * auVar10._8_4_;
          auVar17._12_4_ = auVar48._12_4_ * auVar10._12_4_;
          auVar17._16_4_ = auVar10._16_4_ * 0.0;
          auVar17._20_4_ = auVar10._20_4_ * 0.0;
          auVar17._24_4_ = auVar10._24_4_ * 0.0;
          auVar17._28_4_ = auVar10._28_4_;
          auVar25._4_4_ = auVar47._4_4_ * auVar9._4_4_;
          auVar25._0_4_ = auVar47._0_4_ * auVar9._0_4_;
          auVar25._8_4_ = auVar47._8_4_ * auVar9._8_4_;
          auVar25._12_4_ = auVar47._12_4_ * auVar9._12_4_;
          auVar25._16_4_ = auVar9._16_4_ * 0.0;
          auVar25._20_4_ = auVar9._20_4_ * 0.0;
          auVar25._24_4_ = auVar9._24_4_ * 0.0;
          auVar25._28_4_ = auVar9._28_4_;
          auVar26._4_4_ = auVar48._4_4_ * auVar52._4_4_;
          auVar26._0_4_ = auVar48._0_4_ * auVar52._0_4_;
          auVar26._8_4_ = auVar48._8_4_ * auVar52._8_4_;
          auVar26._12_4_ = auVar48._12_4_ * auVar52._12_4_;
          auVar26._16_4_ = auVar52._16_4_ * 0.0;
          auVar26._20_4_ = auVar52._20_4_ * 0.0;
          auVar26._24_4_ = auVar52._24_4_ * 0.0;
          auVar26._28_4_ = auVar52._28_4_;
          auVar15 = vpminsd_avx2(auVar24,auVar25);
          auVar16 = vpminsd_avx2(auVar17,auVar26);
          auVar15 = vmaxps_avx(auVar15,auVar16);
          auVar10 = vpminsd_avx2(auVar22,auVar23);
          auVar9 = vpmaxsd_avx2(auVar22,auVar23);
          auVar16 = vpmaxsd_avx2(auVar24,auVar25);
          auVar17 = vpmaxsd_avx2(auVar17,auVar26);
          auVar17 = vminps_avx(auVar16,auVar17);
          auVar16 = vmaxps_avx(auVar56,auVar10);
          local_2560 = vmaxps_avx(auVar16,auVar15);
          auVar15 = vminps_avx(auVar43._0_32_,auVar9);
          auVar15 = vminps_avx(auVar15,auVar17);
          auVar15 = vcmpps_avx(local_2560,auVar15,2);
          auVar44 = auVar15._0_16_;
          auVar47 = auVar15._16_16_;
LAB_005efa3a:
          auVar44 = vpackssdw_avx(auVar44,auVar47);
        }
        else {
          auVar46._4_4_ = fVar2;
          auVar46._0_4_ = fVar2;
          auVar46._8_4_ = fVar2;
          auVar46._12_4_ = fVar2;
          auVar46._16_4_ = fVar2;
          auVar46._20_4_ = fVar2;
          auVar46._24_4_ = fVar2;
          auVar46._28_4_ = fVar2;
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + uVar41),auVar46,
                                    *(undefined1 (*) [32])(uVar31 + 0x40 + uVar41));
          auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar51,auVar59._0_32_);
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + uVar42),auVar46,
                                    *(undefined1 (*) [32])(uVar31 + 0x40 + uVar42));
          auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),auVar54,auVar60._0_32_);
          auVar15 = vpmaxsd_avx2(ZEXT1632(auVar44),ZEXT1632(auVar47));
          auVar44 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + uVar37),auVar46,
                                    *(undefined1 (*) [32])(uVar31 + 0x40 + uVar37));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + (uVar41 ^ 0x20)),auVar46
                                    ,*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar41 ^ 0x20)));
          auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),auVar51,auVar59._0_32_);
          auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + (uVar42 ^ 0x20)),auVar46
                                    ,*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar42 ^ 0x20)));
          auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar54,auVar60._0_32_);
          auVar17 = vpminsd_avx2(ZEXT1632(auVar47),ZEXT1632(auVar48));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar31 + 0x100 + (uVar37 ^ 0x20)),auVar46
                                    ,*(undefined1 (*) [32])(uVar31 + 0x40 + (uVar37 ^ 0x20)));
          auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),auVar55,auVar61._0_32_);
          auVar47 = vfmadd213ps_fma(ZEXT1632(auVar47),auVar55,auVar61._0_32_);
          auVar16 = vpmaxsd_avx2(ZEXT1632(auVar44),auVar56);
          local_2560 = vpmaxsd_avx2(auVar15,auVar16);
          auVar15 = vpminsd_avx2(ZEXT1632(auVar47),auVar43._0_32_);
          auVar15 = vpminsd_avx2(auVar17,auVar15);
          auVar15 = vcmpps_avx(local_2560,auVar15,2);
          if (uVar33 == 6) {
            auVar16 = vcmpps_avx(*(undefined1 (*) [32])(uVar31 + 0x1c0),auVar46,2);
            auVar17 = vcmpps_avx(auVar46,*(undefined1 (*) [32])(uVar31 + 0x1e0),1);
            auVar16 = vandps_avx(auVar16,auVar17);
            auVar15 = vandps_avx(auVar16,auVar15);
            auVar44 = auVar15._0_16_;
            auVar47 = auVar15._16_16_;
            goto LAB_005efa3a;
          }
          auVar44 = vpackssdw_avx(auVar15._0_16_,auVar15._16_16_);
        }
        auVar44 = vpsllw_avx(auVar44,0xf);
        if ((((((((auVar44 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar44 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar44 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar44 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf]
           ) goto LAB_005efd82;
        auVar44 = vpacksswb_avx(auVar44,auVar44);
        bVar14 = SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar44 >> 0x17,0) & 1) << 2 | (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar44 >> 0x27,0) & 1) << 4 | (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar44 >> 0x37,0) & 1) << 6 | SUB161(auVar44 >> 0x3f,0) << 7;
        lVar32 = 0;
        for (uVar34 = (ulong)bVar14; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
          lVar32 = lVar32 + 1;
        }
        uVar34 = *(ulong *)(uVar31 + lVar32 * 8);
        uVar33 = bVar14 - 1 & (uint)bVar14;
        uVar35 = (ulong)uVar33;
        pauVar29 = pauVar30;
        if (uVar33 != 0) {
          uVar7 = *(uint *)(local_2560 + lVar32 * 4);
          lVar32 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar32 = lVar32 + 1;
          }
          uVar33 = uVar33 - 1 & uVar33;
          uVar40 = (ulong)uVar33;
          uVar35 = *(ulong *)(uVar31 + lVar32 * 8);
          uVar8 = *(uint *)(local_2560 + lVar32 * 4);
          if (uVar33 == 0) {
            pauVar29 = pauVar30 + 1;
            if (uVar7 < uVar8) {
              *(ulong *)*pauVar30 = uVar35;
              *(uint *)(*pauVar30 + 8) = uVar8;
            }
            else {
              *(ulong *)*pauVar30 = uVar34;
              *(uint *)(*pauVar30 + 8) = uVar7;
              uVar34 = uVar35;
            }
          }
          else {
            auVar44._8_8_ = 0;
            auVar44._0_8_ = uVar34;
            auVar44 = vpunpcklqdq_avx(auVar44,ZEXT416(uVar7));
            auVar47._8_8_ = 0;
            auVar47._0_8_ = uVar35;
            auVar47 = vpunpcklqdq_avx(auVar47,ZEXT416(uVar8));
            lVar32 = 0;
            for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
              lVar32 = lVar32 + 1;
            }
            uVar33 = uVar33 - 1 & uVar33;
            uVar34 = (ulong)uVar33;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = *(ulong *)(uVar31 + lVar32 * 8);
            auVar45 = vpunpcklqdq_avx(auVar48,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
            auVar48 = vpcmpgtd_avx(auVar47,auVar44);
            if (uVar33 == 0) {
              auVar49 = vpshufd_avx(auVar48,0xaa);
              auVar48 = vblendvps_avx(auVar47,auVar44,auVar49);
              auVar44 = vblendvps_avx(auVar44,auVar47,auVar49);
              auVar47 = vpcmpgtd_avx(auVar45,auVar48);
              auVar49 = vpshufd_avx(auVar47,0xaa);
              auVar47 = vblendvps_avx(auVar45,auVar48,auVar49);
              auVar48 = vblendvps_avx(auVar48,auVar45,auVar49);
              auVar45 = vpcmpgtd_avx(auVar48,auVar44);
              auVar49 = vpshufd_avx(auVar45,0xaa);
              auVar45 = vblendvps_avx(auVar48,auVar44,auVar49);
              auVar44 = vblendvps_avx(auVar44,auVar48,auVar49);
              *pauVar30 = auVar44;
              pauVar30[1] = auVar45;
              uVar34 = auVar47._0_8_;
              pauVar29 = pauVar30 + 2;
            }
            else {
              lVar32 = 0;
              for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
                lVar32 = lVar32 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar35 = (ulong)uVar33;
              auVar49._8_8_ = 0;
              auVar49._0_8_ = *(ulong *)(uVar31 + lVar32 * 8);
              auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
              if (uVar33 == 0) {
                auVar12 = vpshufd_avx(auVar48,0xaa);
                auVar48 = vblendvps_avx(auVar47,auVar44,auVar12);
                auVar44 = vblendvps_avx(auVar44,auVar47,auVar12);
                auVar47 = vpcmpgtd_avx(auVar49,auVar45);
                auVar12 = vpshufd_avx(auVar47,0xaa);
                auVar47 = vblendvps_avx(auVar49,auVar45,auVar12);
                auVar45 = vblendvps_avx(auVar45,auVar49,auVar12);
                auVar49 = vpcmpgtd_avx(auVar45,auVar44);
                auVar12 = vpshufd_avx(auVar49,0xaa);
                auVar49 = vblendvps_avx(auVar45,auVar44,auVar12);
                auVar44 = vblendvps_avx(auVar44,auVar45,auVar12);
                auVar45 = vpcmpgtd_avx(auVar47,auVar48);
                auVar12 = vpshufd_avx(auVar45,0xaa);
                auVar45 = vblendvps_avx(auVar47,auVar48,auVar12);
                auVar47 = vblendvps_avx(auVar48,auVar47,auVar12);
                auVar48 = vpcmpgtd_avx(auVar49,auVar47);
                auVar12 = vpshufd_avx(auVar48,0xaa);
                auVar48 = vblendvps_avx(auVar49,auVar47,auVar12);
                auVar47 = vblendvps_avx(auVar47,auVar49,auVar12);
                *pauVar30 = auVar44;
                pauVar30[1] = auVar47;
                pauVar30[2] = auVar48;
                pauVar29 = pauVar30 + 3;
                uVar34 = auVar45._0_8_;
              }
              else {
                *pauVar30 = auVar44;
                pauVar30[1] = auVar47;
                pauVar30[2] = auVar45;
                pauVar30[3] = auVar49;
                lVar32 = 0x30;
                do {
                  lVar38 = lVar32;
                  lVar32 = 0;
                  for (uVar34 = uVar35; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    lVar32 = lVar32 + 1;
                  }
                  uVar34 = *(ulong *)(uVar31 + lVar32 * 8);
                  auVar45._8_8_ = 0;
                  auVar45._0_8_ = uVar34;
                  auVar44 = vpunpcklqdq_avx(auVar45,ZEXT416(*(uint *)(local_2560 + lVar32 * 4)));
                  *(undefined1 (*) [16])(pauVar30[1] + lVar38) = auVar44;
                  uVar35 = uVar35 - 1 & uVar35;
                  lVar32 = lVar38 + 0x10;
                } while (uVar35 != 0);
                pauVar29 = (undefined1 (*) [16])(pauVar30[1] + lVar38);
                if (lVar38 + 0x10 != 0) {
                  lVar32 = 0x10;
                  pauVar36 = pauVar30;
                  do {
                    auVar44 = pauVar36[1];
                    pauVar36 = pauVar36 + 1;
                    uVar33 = vextractps_avx(auVar44,2);
                    lVar38 = lVar32;
                    do {
                      if (uVar33 <= *(uint *)(pauVar30[-1] + lVar38 + 8)) {
                        pauVar39 = (undefined1 (*) [16])(*pauVar30 + lVar38);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar30 + lVar38) =
                           *(undefined1 (*) [16])(pauVar30[-1] + lVar38);
                      lVar38 = lVar38 + -0x10;
                      pauVar39 = pauVar30;
                    } while (lVar38 != 0);
                    *pauVar39 = auVar44;
                    lVar32 = lVar32 + 0x10;
                  } while (pauVar29 != pauVar36);
                  uVar34 = *(ulong *)*pauVar29;
                }
              }
            }
          }
        }
      }
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(uVar34 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar43 = ZEXT3264(CONCAT428(uVar6,CONCAT424(uVar6,CONCAT420(uVar6,CONCAT416(uVar6,CONCAT412(
                                                  uVar6,CONCAT48(uVar6,CONCAT44(uVar6,uVar6))))))));
    }
LAB_005efd82:
    if (pauVar30 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }